

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O3

void __thiscall PointBlock<3U>::print_block(PointBlock<3U> *this,ProxyWithLink *cp,bool verbose)

{
  pointer pPVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  long lVar3;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  ulong local_68;
  code *local_60;
  PointBlock<3U> *local_58;
  code *local_50;
  Point *local_48;
  code *local_40;
  
  local_68 = (ulong)(uint)(cp->super_Proxy).gid_;
  local_58 = (PointBlock<3U> *)&this->box;
  local_48 = &(this->box).max;
  local_50 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  local_40 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  format_str.size_ = 0x16;
  format_str.data_ = "[{}] Box:    {} -- {}\n";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_68;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xff1;
  fmt::v7::vprint(_stdout,format_str,args);
  local_68 = (ulong)(uint)(cp->super_Proxy).gid_;
  local_48 = &(this->bounds).max;
  local_50 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  local_40 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  format_str_00.size_ = 0x16;
  format_str_00.data_ = "[{}] Bounds: {} -- {}\n";
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_68;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xff1;
  local_58 = this;
  fmt::v7::vprint(_stdout,format_str_00,args_00);
  if ((int)CONCAT71(in_register_00000011,verbose) == 0) {
    local_68 = (ulong)(uint)(cp->super_Proxy).gid_;
    local_58 = (PointBlock<3U> *)
               (((long)(this->points).
                       super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->points).
                       super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
    format_str_02.size_ = 0x10;
    format_str_02.data_ = "[{}] Points: {}\n";
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_68;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 0x41;
    fmt::v7::vprint(_stdout,format_str_02,args_02);
  }
  else {
    pPVar1 = (this->points).
             super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->points).
        super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar1) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        local_68 = (long)(pPVar1->super_array<float,_3UL>)._M_elems + lVar3;
        local_60 = fmt::v7::detail::
                   value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                   ::
                   format_custom_arg<diy::Point<float,3u>,fmt::v7::detail::fallback_formatter<diy::Point<float,3u>,char,void>>
        ;
        format_str_01.size_ = 5;
        format_str_01.data_ = "  {}\n";
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0xf;
        fmt::v7::vprint(_stdout,format_str_01,args_01);
        uVar2 = uVar2 + 1;
        pPVar1 = (this->points).
                 super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < (ulong)(((long)(this->points).
                                      super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 2
                               ) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void          print_block(const diy::Master::ProxyWithLink& cp,  // communication proxy
                              bool verbose)                          // amount of output
    {
        fmt::print("[{}] Box:    {} -- {}\n", cp.gid(), box.min, box.max);
        fmt::print("[{}] Bounds: {} -- {}\n", cp.gid(), bounds.min, bounds.max);

        if (verbose)
        {
            for (size_t i = 0; i < points.size(); ++i)
                fmt::print("  {}\n", points[i]);
        } else
            fmt::print("[{}] Points: {}\n", cp.gid(), points.size());
    }